

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

void __thiscall
Assimp::MemoryIOSystem::MemoryIOSystem(MemoryIOSystem *this,uint8_t *buff,size_t len,IOSystem *io)

{
  IOSystem *io_local;
  size_t len_local;
  uint8_t *buff_local;
  MemoryIOSystem *this_local;
  
  IOSystem::IOSystem(&this->super_IOSystem);
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__MemoryIOSystem_00f3ccd8;
  this->buffer = buff;
  this->length = len;
  this->existing_io = io;
  memset(&this->created_streams,0,0x18);
  std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::vector
            (&this->created_streams);
  return;
}

Assistant:

MemoryIOSystem(const uint8_t* buff, size_t len, IOSystem* io)
    : buffer(buff)
    , length(len)
    , existing_io(io)
    , created_streams() {
        // empty
    }